

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O2

tuple<int,_int,_int>
libtorrent::merkle_find_known_subtree
          (span<const_libtorrent::digest32<256L>_> tree,int block_index,int num_valid_leafs)

{
  undefined1 auVar1 [16];
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  _Head_base<0UL,_int,_false> _Var6;
  int in_register_00000014;
  uint uVar7;
  _Tuple_impl<1UL,_int,_int> _Var8;
  digest32<256L> *this;
  int in_R8D;
  uint uVar9;
  long lVar10;
  int iVar11;
  int i;
  tuple<int,_int,_int> tVar12;
  
  auVar1._4_4_ = in_register_00000014;
  auVar1._0_4_ = block_index;
  _Var8 = (_Tuple_impl<1UL,_int,_int>)tree.m_ptr;
  auVar1._8_8_ = (long)in_register_00000014 >> 0x1f;
  iVar2 = SUB164(auVar1 / SEXT816(2),0);
  uVar5 = iVar2 + num_valid_leafs;
  iVar11 = (-(uint)((uVar5 & 1) == 0) | 1) + uVar5;
  uVar5 = 1;
  uVar7 = num_valid_leafs;
  do {
    uVar4 = -uVar5;
    if ((num_valid_leafs & 1U) == 0) {
      uVar4 = uVar5;
    }
    uVar9 = in_R8D - (uVar4 + uVar7);
    if ((int)uVar5 <= (int)uVar9) {
      uVar9 = uVar5;
    }
    if ((int)uVar9 < 1) {
      uVar9 = 0;
    }
    lVar10 = (ulong)uVar9 + 1;
    this = (digest32<256L> *)((long)(int)(uVar4 + uVar7 + iVar2) * 0x20 + tree.m_len);
    while (lVar10 = lVar10 + -1, lVar10 != 0) {
      bVar3 = digest32<256L>::is_all_zeros(this);
      this = this + 1;
      _Var6._M_head_impl = extraout_EDX;
      if (bVar3) goto LAB_0020af5d;
    }
    uVar7 = uVar7 - (-(num_valid_leafs & 1U) & uVar5);
    uVar5 = uVar5 * 2;
    iVar11 = (iVar11 + -1) / 2;
    bVar3 = digest32<256L>::is_all_zeros((digest32<256L> *)((long)iVar11 * 0x20 + tree.m_len));
    num_valid_leafs = num_valid_leafs >> 1;
    _Var6._M_head_impl = extraout_EDX_00;
  } while (bVar3);
LAB_0020af5d:
  *(int *)_Var8 = iVar11;
  *(uint *)((long)_Var8 + 4) = uVar5;
  *(uint *)((long)_Var8 + 8) = uVar7;
  tVar12.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       _Var6._M_head_impl;
  tVar12.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> = _Var8;
  return (tuple<int,_int,_int>)tVar12.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

std::tuple<int, int, int> merkle_find_known_subtree(span<sha256_hash const> const tree
		, int const block_index, int const num_valid_leafs)
	{
		// find the largest block of leafs from a single subtree we know the hashes of
		int leafs_start = block_index;
		int leafs_size = 1;
		int const first_leaf = int(tree.size() / 2);
		int root_index = merkle_get_sibling(first_leaf + block_index);
		for (int i = block_index;; i >>= 1)
		{
			int const first_check_index = leafs_start + ((i & 1) ? -leafs_size : leafs_size);
			for (int j = 0; j < std::min(leafs_size, num_valid_leafs - first_check_index); ++j)
			{
				if (tree[first_leaf + first_check_index + j].is_all_zeros())
					return std::make_tuple(leafs_start, leafs_size, root_index);
			}
			if (i & 1) leafs_start -= leafs_size;
			leafs_size *= 2;
			root_index = merkle_get_parent(root_index);
			// if an inner node is known then its parent must be known too
			// so if the root is known the next sibling subtree should already
			// be computed if all of its leafs have valid hashes
			if (!tree[root_index].is_all_zeros()) break;
			TORRENT_ASSERT(root_index != 0);
			TORRENT_ASSERT(leafs_start >= 0);
			TORRENT_ASSERT(leafs_size <= merkle_num_leafs(num_valid_leafs));
		}

		TORRENT_ASSERT(leafs_start >= 0);
		TORRENT_ASSERT(leafs_start < merkle_num_leafs(num_valid_leafs));
		TORRENT_ASSERT(leafs_start + leafs_size > block_index);

		return std::make_tuple(leafs_start, leafs_size, root_index);
	}